

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Memory.h
# Opt level: O0

int __thiscall
Eigen::internal::SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
          (SparseLUImpl<double,int> *this,Matrix<int,__1,_1,_0,__1,_1> *vec,int *length,int nbElts,
          int keep_prev,int *num_expansions)

{
  int *piVar1;
  SegmentReturnType local_d8;
  bad_alloc *anon_var_0_1;
  undefined4 local_9c;
  int tries;
  bad_alloc *anon_var_0;
  SegmentReturnType local_80;
  undefined1 local_58 [8];
  Matrix<int,__1,_1,_0,__1,_1> old_vec;
  int local_40;
  int new_len;
  float alpha;
  int *num_expansions_local;
  int keep_prev_local;
  int nbElts_local;
  int *length_local;
  Matrix<int,__1,_1,_0,__1,_1> *vec_local;
  SparseLUImpl<double,_int> *this_local;
  
  if ((*num_expansions == 0) || (keep_prev != 0)) {
    local_40 = *length;
  }
  else {
    old_vec.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
         *length + 1;
    old_vec.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ =
         (int)((float)*length * 1.5);
    piVar1 = std::max<int>((int *)((long)&old_vec.
                                          super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows + 4),
                           (int *)&old_vec.
                                   super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows);
    local_40 = *piVar1;
  }
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_58);
  if (0 < nbElts) {
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::segment
              (&local_80,(DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)vec,0,(long)nbElts);
    Matrix<int,-1,1,0,-1,1>::operator=
              ((Matrix<int,_1,1,0,_1,1> *)local_58,
               (MatrixBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_80);
  }
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,(long)local_40);
  if (0 < nbElts) {
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::segment
              (&local_d8,(DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)vec,0,(long)nbElts);
    Block<Eigen::Matrix<int,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false> *)&local_d8,
               (DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_58);
  }
  *length = local_40;
  if (*num_expansions != 0) {
    *num_expansions = *num_expansions + 1;
  }
  local_9c = 1;
  Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_58);
  return 0;
}

Assistant:

Index  SparseLUImpl<Scalar,Index>::expand(VectorType& vec, Index& length, Index nbElts, Index keep_prev, Index& num_expansions) 
{
  
  float alpha = 1.5; // Ratio of the memory increase 
  Index new_len; // New size of the allocated memory
  
  if(num_expansions == 0 || keep_prev) 
    new_len = length ; // First time allocate requested
  else 
    new_len = (std::max)(length+1,Index(alpha * length));
  
  VectorType old_vec; // Temporary vector to hold the previous values   
  if (nbElts > 0 )
    old_vec = vec.segment(0,nbElts); 
  
  //Allocate or expand the current vector
#ifdef EIGEN_EXCEPTIONS
  try
#endif
  {
    vec.resize(new_len); 
  }
#ifdef EIGEN_EXCEPTIONS
  catch(std::bad_alloc& )
#else
  if(!vec.size())
#endif
  {
    if (!num_expansions)
    {
      // First time to allocate from LUMemInit()
      // Let LUMemInit() deals with it.
      return -1;
    }
    if (keep_prev)
    {
      // In this case, the memory length should not not be reduced
      return new_len;
    }
    else 
    {
      // Reduce the size and increase again 
      Index tries = 0; // Number of attempts
      do 
      {
        alpha = (alpha + 1)/2;
        new_len = (std::max)(length+1,Index(alpha * length));
#ifdef EIGEN_EXCEPTIONS
        try
#endif
        {
          vec.resize(new_len); 
        }
#ifdef EIGEN_EXCEPTIONS
        catch(std::bad_alloc& )
#else
        if (!vec.size())
#endif
        {
          tries += 1; 
          if ( tries > 10) return new_len; 
        }
      } while (!vec.size());
    }
  }
  //Copy the previous values to the newly allocated space 
  if (nbElts > 0)
    vec.segment(0, nbElts) = old_vec;   
   
  
  length  = new_len;
  if(num_expansions) ++num_expansions;
  return 0; 
}